

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint needle;
  uint needle_00;
  size_t sVar2;
  int max;
  int min;
  size_t n;
  int arr [200];
  timeval tv;
  char **argv_local;
  int argc_local;
  
  gettimeofday((timeval *)(arr + 0xc6),(__timezone_ptr_t)0x0);
  srand(arr[0xc6]);
  for (_max = 0; _max < 200; _max = _max + 1) {
    iVar1 = rand();
    arr[_max - 2] = iVar1 % 0x15;
  }
  needle = minimum((int *)&n,200);
  needle_00 = maximum((int *)&n,200);
  sVar2 = n_occurences((int *)&n,200,needle);
  printf("The minimum is %d and it occurs %zu times.\n",(ulong)needle,sVar2);
  sVar2 = n_occurences((int *)&n,200,needle_00);
  printf("The maximum is %d and it occurs %zu times.\n",(ulong)needle_00,sVar2);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  struct timeval tv;
  gettimeofday(&tv, NULL);

  int arr[ARR_LEN];
  srand((unsigned int)tv.tv_sec);
  for (size_t n = 0; n < ARR_LEN; n++) {
    arr[n] = rand() % 21;
  }

  int min = minimum(arr, ARR_LEN);
  int max = maximum(arr, ARR_LEN);
  printf("The minimum is %d and it occurs %zu times.\n", min, n_occurences(arr, ARR_LEN, min));
  printf("The maximum is %d and it occurs %zu times.\n", max, n_occurences(arr, ARR_LEN, max));

  return 0;
}